

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O3

istream * shadow::serialization_detail::serialization_type_selector<bool,_void>::
          deserialize_dispatch(istream *in,any *value)

{
  long *plVar1;
  int iVar2;
  holder_base *phVar3;
  bool bVar4;
  string boolstring;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_68 = 0;
  local_60 = 0;
  local_70 = &local_60;
  std::operator>>(in,(string *)&local_70);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"true","");
  plVar1 = local_50;
  if (local_68 == local_48) {
    if (local_68 == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp(local_70,local_50,local_68);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (plVar1 != local_40) {
    operator_delete(plVar1,local_40[0] + 1);
  }
  phVar3 = (holder_base *)((long)&value->field_1 + 8);
  if (value->on_heap_ != false) {
    phVar3 = (value->field_1).heap + 1;
  }
  *(bool *)&phVar3->_vptr_holder_base = bVar4;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return in;
}

Assistant:

static std::istream&
    deserialize_dispatch(std::istream& in, any& value)
    {
        std::string boolstring;

        in >> boolstring;

        if(boolstring == std::string("true"))
        {
            value.get<bool>() = true;
        }
        else
        {
            value.get<bool>() = false;
        }

        return in;
    }